

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O3

int Ssw_SmlCheckXorImplication(Ssw_Sml_t *p,Aig_Obj_t *pObjLi,Aig_Obj_t *pObjLo,Aig_Obj_t *pCand)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  if ((pObjLo->field_0x18 & 8) != 0) {
    __assert_fail("pObjLo->fPhase == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSim.c"
                  ,0xce,
                  "int Ssw_SmlCheckXorImplication(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Obj_t *)"
                 );
  }
  iVar4 = p->nWordsTotal;
  lVar1 = (long)(*(int *)(((ulong)pCand & 0xfffffffffffffffe) + 0x24) * iVar4) * 4;
  lVar2 = (long)(pObjLi->Id * iVar4) * 4;
  lVar3 = (long)(pObjLo->Id * iVar4) * 4;
  iVar5 = p->nWordsPref;
  lVar6 = (long)iVar5;
  if ((((uint)pCand ^ *(uint *)(((ulong)pCand & 0xfffffffffffffffe) + 0x18) >> 3) & 1) == 0) {
    if (iVar5 < iVar4) {
      do {
        if ((*(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar1) &
            (*(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar3) ^
            *(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar2))) != 0) {
          return 0;
        }
        lVar6 = lVar6 + 1;
      } while (iVar4 != lVar6);
    }
  }
  else if (iVar5 < iVar4) {
    do {
      if (((*(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar3) ^
           *(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar2)) &
          ~*(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar1)) != 0) {
        return 0;
      }
      lVar6 = lVar6 + 1;
    } while (iVar4 != lVar6);
  }
  return 1;
}

Assistant:

int Ssw_SmlCheckXorImplication( Ssw_Sml_t * p, Aig_Obj_t * pObjLi, Aig_Obj_t * pObjLo, Aig_Obj_t * pCand )
{
    unsigned * pSimLi, * pSimLo, * pSimCand;
    int k;
    assert( pObjLo->fPhase == 0 );
    // pObjLi->fPhase may be 1, but the LI simulation data is not complemented!
    pSimCand = Ssw_ObjSim( p, Aig_Regular(pCand)->Id );
    pSimLi   = Ssw_ObjSim( p, pObjLi->Id );
    pSimLo   = Ssw_ObjSim( p, pObjLo->Id );
    if ( Aig_Regular(pCand)->fPhase ^ Aig_IsComplement(pCand) )
    {
        for ( k = p->nWordsPref; k < p->nWordsTotal; k++ )
            if ( ~pSimCand[k] & (pSimLi[k] ^ pSimLo[k]) )
                return 0;
    }
    else
    {
        for ( k = p->nWordsPref; k < p->nWordsTotal; k++ )
            if ( pSimCand[k] & (pSimLi[k] ^ pSimLo[k]) )
                return 0;
    }
    return 1;
}